

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O3

bool __thiscall
Am_Rich_Text_Data::Calc_Line_Dim
          (Am_Rich_Text_Data *this,Am_Drawonable *inDrawonable,Am_Text_Index inStartIndex,
          unsigned_long inTargetWidth,Am_Text_Length *outCharsOnLine,unsigned_short *outAscent,
          unsigned_short *outDescent)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  Am_Text_Style_Run *inStyleRun;
  Am_Text_Style_Run *pAVar4;
  int iVar5;
  long lVar6;
  Am_Rich_Text_Data *pAVar7;
  Am_Text_Style_Run **ppAVar8;
  Am_Text_Fragment *inStartFrag;
  Am_Rich_Text_Data *inRelIndex;
  int iVar9;
  ulong uVar10;
  unsigned_long uVar11;
  SStyleRunInfo local_88;
  Am_Text_Style_Run *local_68;
  Am_Text_Length *local_60;
  ushort *local_58;
  unsigned_long local_50;
  ulong local_48;
  Am_Drawonable *local_40;
  ulong local_38;
  
  *outCharsOnLine = 0;
  *outAscent = 0;
  *outDescent = 0;
  inStartFrag = this->mHeadFragment;
  inRelIndex = (Am_Rich_Text_Data *)outAscent;
  if (inStartFrag != (Am_Text_Fragment *)0x0) {
    pAVar7 = (Am_Rich_Text_Data *)0x0;
    do {
      inRelIndex = (Am_Rich_Text_Data *)
                   ((long)&(pAVar7->super_Am_Wrapper).super_Am_Registered_Type.
                           _vptr_Am_Registered_Type + inStartFrag->mStrLen);
      if (inStartIndex <= inRelIndex) {
        inRelIndex = (Am_Rich_Text_Data *)(~(ulong)pAVar7 + inStartIndex);
        goto LAB_00245599;
      }
      inStartFrag = inStartFrag->mNext;
      pAVar7 = inRelIndex;
    } while (inStartFrag != (Am_Text_Fragment *)0x0);
  }
  inStartFrag = (Am_Text_Fragment *)0x0;
LAB_00245599:
  ppAVar8 = &this->mHeadStyle;
  uVar3 = 0;
  do {
    uVar10 = uVar3;
    inStyleRun = *ppAVar8;
    uVar3 = uVar10 + inStyleRun->mCharsInRun;
    ppAVar8 = &inStyleRun->mNext;
  } while (uVar3 < inStartIndex);
  uVar11 = (uVar10 - inStartIndex) + inStyleRun->mCharsInRun + 1;
  local_48 = 0;
  local_60 = outCharsOnLine;
  local_58 = outAscent;
  local_50 = inTargetWidth;
  local_40 = inDrawonable;
  do {
    pAVar7 = inRelIndex;
    Find_Next_Break((SBreakInfo *)&local_88,(Am_Text_Index)inRelIndex,inStartFrag);
    iVar2 = (int)local_88.width_used;
    local_38 = CONCAT44(local_88.descent,local_88.ascent);
    if (local_38 == 0) {
      uVar3 = 0;
      lVar6 = 0;
      iVar9 = 0;
      iVar5 = 0;
      pAVar4 = inStyleRun;
    }
    else {
      iVar5 = 0;
      iVar9 = 0;
      lVar6 = 0;
      uVar3 = 0;
      local_68 = inStyleRun;
      do {
        uVar10 = local_38 - uVar3;
        if (uVar11 <= local_38 - uVar3) {
          uVar10 = uVar11;
        }
        Calc_SR_Dim(&local_88,pAVar7,local_40,inStyleRun,inStartFrag,(Am_Text_Offset)inRelIndex,
                    uVar10);
        lVar6 = lVar6 + CONCAT44(local_88.width_used._4_4_,(int)local_88.width_used);
        uVar3 = uVar3 + uVar10;
        uVar11 = uVar11 - uVar10;
        if (iVar9 < local_88.ascent) {
          iVar9 = local_88.ascent;
        }
        if (iVar5 < local_88.descent) {
          iVar5 = local_88.descent;
        }
        pAVar4 = local_68;
        inStartFrag = local_88.end_frag;
        inRelIndex = (Am_Rich_Text_Data *)local_88.end_frag_offset;
        if (iVar2 == 2) break;
        if (uVar11 == 0) {
          inStyleRun = inStyleRun->mNext;
          if (inStyleRun == (Am_Text_Style_Run *)0x0) {
            Am_Error("Ran out of Style_Run info.");
          }
          uVar11 = inStyleRun->mCharsInRun;
        }
        pAVar4 = inStyleRun;
      } while (uVar3 < local_38);
    }
    local_48 = local_48 + lVar6;
    if (local_50 < local_48) goto LAB_0024571e;
    *local_60 = *local_60 + uVar3;
    uVar1 = *local_58;
    if ((int)(uint)uVar1 < iVar9) {
      uVar1 = (ushort)iVar9;
    }
    *local_58 = uVar1;
    uVar1 = *outDescent;
    if ((int)(uint)uVar1 < iVar5) {
      uVar1 = (ushort)iVar5;
    }
    *outDescent = uVar1;
    inStyleRun = pAVar4;
  } while (iVar2 != 2);
  iVar2 = 2;
LAB_0024571e:
  return iVar2 == 2;
}

Assistant:

bool
Am_Rich_Text_Data::Calc_Line_Dim(Am_Drawonable *inDrawonable,
                                 Am_Text_Index inStartIndex,
                                 unsigned long inTargetWidth,
                                 Am_Text_Length &outCharsOnLine,
                                 unsigned short &outAscent,
                                 unsigned short &outDescent)
{
  unsigned long cumChars = 0, cumWidth = 0;
  Am_Text_Index relSRIndex = 0, chars_rem_in_sr = 0;
  SBreakInfo break_info;
  SStyleRunInfo sr_info;

  outCharsOnLine = 0;
  outAscent = 0;
  outDescent = 0;

  sr_info.end_frag = Get_Fragment_At(inStartIndex, sr_info.end_frag_offset);
  Am_Text_Style_Run *curSR = Get_Style_Run_At(inStartIndex, relSRIndex);

  chars_rem_in_sr = curSR->Length() - relSRIndex + 1; // incl cur char too

  // COMMENT .....
  while (true) {
    break_info = Find_Next_Break(sr_info.end_frag_offset, sr_info.end_frag);

    // this loop calculates how many pixels are needed to print until
    // the next break. There may be more than one style run until that break

    Am_Text_Length break_chars_used = 0, max_chars = 0;
    unsigned long break_width_used = 0;
    int break_ascent = 0, break_descent = 0;

    // Continue stepping through the style runs, until having processed
    // break_info.len characters or used up more pixels than were remaining
    while (break_chars_used < break_info.len) {
      max_chars = min(break_info.len - break_chars_used, chars_rem_in_sr);

      sr_info = Calc_SR_Dim(inDrawonable, curSR, sr_info.end_frag,
                            sr_info.end_frag_offset, max_chars);

      // Update data about this break
      break_width_used += sr_info.width_used;
      break_chars_used += max_chars;
      chars_rem_in_sr -= max_chars;

      break_ascent = max(sr_info.ascent, break_ascent);
      break_descent = max(sr_info.descent, break_descent);

      if (break_info.why == EndOfText)
        break;

      // skip to next style run, since there should be more test remaining
      if (chars_rem_in_sr == 0) {
        curSR = curSR->Next();
        if (curSR == nullptr) {
          Am_Error("Ran out of Style_Run info.");
          // this should never happen... eventually throw an exception
        }
        chars_rem_in_sr = curSR->Length();
      }
    }

    if (cumWidth + break_width_used <= inTargetWidth) {
      outCharsOnLine += break_chars_used;

      outAscent = max(break_ascent, outAscent);
      outDescent = max(break_descent, outDescent);
      cumChars += break_chars_used;
      cumWidth += break_width_used;
    } else
      break;

    if (break_info.why == EndOfText)
      break;
  }

  return (break_info.why == EndOfText) ? true : false;
}